

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::second_tick(torrent *this,int tick_interval_ms)

{
  undefined1 *puVar1;
  ulong uVar2;
  pointer pppVar3;
  peer_connection *this_00;
  long lVar4;
  service_type *psVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  seconds32 sVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  long *plVar12;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> op;
  long lVar13;
  undefined8 uVar14;
  pointer pppVar15;
  _List_node_base *p_Var16;
  int tick_interval_ms_local;
  undefined1 local_60 [40];
  shared_ptr<libtorrent::aux::torrent> self;
  
  tick_interval_ms_local = tick_interval_ms;
  ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::torrent,void>
            ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&self,
             (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
  p_Var16 = (_List_node_base *)&this->m_extensions;
  while (p_Var16 = (((_List_base<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
                      *)&p_Var16->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var16 != (_List_node_base *)&this->m_extensions) {
    (**(code **)(*(long *)p_Var16[1]._M_next + 0x28))();
  }
  uVar8 = (uint)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48;
  if ((uVar8 >> 0x1a & 1) == 0) {
    if (((uVar8 >> 0x18 & 1) != 0) && ((this->field_0x600 & 1) != 0)) {
      sVar9 = upload_mode_time(this);
      iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[0x2e])();
      iVar10 = session_settings::get_int((session_settings *)CONCAT44(extraout_var,iVar10),0x4041);
      if (iVar10 <= sVar9.__r) {
        set_upload_mode(this,false);
      }
    }
    uVar2 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
    if ((int)uVar2 < 0 || (uVar2 & 0x18000000) == 0) {
      iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[0x2e])();
      bVar6 = session_settings::get_bool
                        ((session_settings *)CONCAT44(extraout_var_00,iVar10),0x8010);
      if (bVar6) {
        iVar10 = upload_limit(this);
        iVar11 = download_limit(this);
        if ((0 < iVar11) &&
           (iVar11 <= *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>
                               .field_0x58)) {
          iVar11 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                     _vptr_session_logger[5])();
          if ((*(uint *)(CONCAT44(extraout_var_01,iVar11) + 0x68) >> 9 & 1) != 0) {
            iVar11 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                       _vptr_session_logger[5])();
            get_handle((torrent *)local_60);
            local_60._24_4_ = 3;
            alert_manager::
            emplace_alert<libtorrent::performance_alert,libtorrent::torrent_handle,libtorrent::performance_alert::performance_warning_t>
                      ((alert_manager *)CONCAT44(extraout_var_02,iVar11),(torrent_handle *)local_60,
                       (performance_warning_t *)(local_60 + 0x18));
            ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                      ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
          }
        }
        if ((0 < iVar10) &&
           (iVar10 <= *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>
                               .field_0x48)) {
          iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                     _vptr_session_logger[5])();
          if ((*(uint *)(CONCAT44(extraout_var_03,iVar10) + 0x68) >> 9 & 1) != 0) {
            iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                       _vptr_session_logger[5])();
            get_handle((torrent *)local_60);
            local_60._24_4_ = 2;
            alert_manager::
            emplace_alert<libtorrent::performance_alert,libtorrent::torrent_handle,libtorrent::performance_alert::performance_warning_t>
                      ((alert_manager *)CONCAT44(extraout_var_04,iVar10),(torrent_handle *)local_60,
                       (performance_warning_t *)(local_60 + 0x18));
            ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                      ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
          }
        }
      }
      if (((this->m_time_critical_pieces).
           super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           (this->m_time_critical_pieces).
           super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         (((this->super_torrent_hot_members).field_0x4b & 0x81) == 0)) {
        request_time_critical_pieces(this);
      }
      maybe_connect_web_seeds(this);
      this->m_swarm_last_seen_complete = this->m_last_seen_complete;
      pppVar3 = (this->super_torrent_hot_members).m_connections.
                super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                .
                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pppVar15 = (this->super_torrent_hot_members).m_connections.
                      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                      .
                      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; pppVar15 != pppVar3;
          pppVar15 = pppVar15 + 1) {
        this_00 = *pppVar15;
        lVar4 = this_00->m_last_seen_complete;
        lVar13 = this->m_swarm_last_seen_complete;
        if (this->m_swarm_last_seen_complete < lVar4) {
          lVar13 = lVar4;
        }
        this->m_swarm_last_seen_complete = lVar13;
        peer_connection::second_tick(this_00,tick_interval_ms_local);
      }
      iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[5])();
      if ((*(uint *)(CONCAT44(extraout_var_05,iVar10) + 0x68) >> 0xb & 1) != 0) {
        iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[5])();
        get_handle((torrent *)local_60);
        alert_manager::
        emplace_alert<libtorrent::stats_alert,libtorrent::torrent_handle,int_const&,libtorrent::aux::stat&>
                  ((alert_manager *)CONCAT44(extraout_var_06,iVar10),(torrent_handle *)local_60,
                   &tick_interval_ms_local,&this->m_stat);
        ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
      }
      this->m_total_uploaded =
           this->m_total_uploaded +
           (long)*(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                          field_0x8;
      this->m_total_downloaded =
           this->m_total_downloaded +
           (long)*(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                          field_0x28;
      stat::second_tick(&this->m_stat,tick_interval_ms_local);
      set_need_save_resume(this,(resume_data_flags_t)0x8);
      iVar10 = *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                        field_0x1c +
               *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                        field_0xc;
      puVar1 = &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x4c;
      iVar11 = iVar10 + *(int *)puVar1;
      if ((iVar11 != 0 && SCARRY4(iVar10,*(int *)puVar1) == iVar11 < 0) ||
         (iVar10 = *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                            field_0x3c +
                   *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                            field_0x2c,
         puVar1 = &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x5c,
         iVar11 = iVar10 + *(int *)puVar1,
         iVar11 != 0 && SCARRY4(iVar10,*(int *)puVar1) == iVar11 < 0)) {
        state_updated(this);
      }
      bVar6 = is_inactive_internal(this);
      iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[0x2e])();
      bVar7 = session_settings::get_bool
                        ((session_settings *)CONCAT44(extraout_var_07,iVar10),0x800d);
      if (bVar7) {
        if (bVar6 == ((this->field_0x600 & 0x40) == 0)) {
          if ((*(uint *)&this->field_0x5d8 >> 0x1a & 1) == 0) {
            iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                       _vptr_session_logger[0x2e])();
            iVar10 = session_settings::get_int
                               ((session_settings *)CONCAT44(extraout_var_08,iVar10),0x4038);
            local_60._0_8_ = (long)iVar10 * 1000000000;
            boost::asio::
            basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
            ::expires_after(&this->m_inactivity_timer,(duration *)local_60);
            ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                       (local_60 + 0x18),
                       &self.
                        super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
            psVar5 = (this->m_inactivity_timer).impl_.service_;
            local_60._0_8_ =
                 (__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                 (local_60 + 0x18);
            plVar12 = (long *)__tls_get_addr(&PTR_004d3f18);
            if (*plVar12 == 0) {
              uVar14 = 0;
            }
            else {
              uVar14 = *(undefined8 *)(*plVar12 + 8);
            }
            op._M_head_impl =
                 (piece_picker *)
                 boost::asio::detail::thread_info_base::
                 allocate<boost::asio::detail::thread_info_base::default_tag>(uVar14,0x68);
            uVar14 = local_60._32_8_;
            ((operation *)&(op._M_head_impl)->m_piece_map)->next_ = (scheduler_operation *)0x0;
            ((operation *)&(op._M_head_impl)->m_piece_map)->func_ =
                 boost::asio::detail::
                 wait_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:10344:35),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 ::do_complete;
            ((operation *)&(op._M_head_impl)->m_piece_map)->task_result_ = 0;
            *(int *)&((op._M_head_impl)->m_pads_in_piece)._M_h._M_buckets = 0;
            *(bool *)((long)&((op._M_head_impl)->m_pads_in_piece)._M_h._M_buckets + 4) = false;
            ((op._M_head_impl)->m_pads_in_piece)._M_h._M_bucket_count =
                 (size_type)&boost::system::detail::cat_holder<void>::system_category_instance;
            local_60._32_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            ((op._M_head_impl)->m_pads_in_piece)._M_h._M_before_begin._M_nxt =
                 (_Hash_node_base *)local_60._24_8_;
            ((op._M_head_impl)->m_pads_in_piece)._M_h._M_element_count = uVar14;
            local_60._24_8_ = (element_type *)0x0;
            local_60._8_8_ = op._M_head_impl;
            boost::asio::detail::
            handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
            ::handler_work_base((handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
                                 *)&((op._M_head_impl)->m_pads_in_piece)._M_h._M_rehash_policy,
                                &(this->m_inactivity_timer).impl_.executor_);
            (this->m_inactivity_timer).impl_.implementation_.might_have_pending_waits = true;
            local_60._16_8_ = op._M_head_impl;
            boost::asio::detail::epoll_reactor::
            schedule_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
                      (psVar5->scheduler_,&psVar5->timer_queue_,
                       &(this->m_inactivity_timer).impl_.implementation_.expiry,
                       &(this->m_inactivity_timer).impl_.implementation_.timer_data,
                       (wait_op *)op._M_head_impl);
            local_60._8_8_ =
                 (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                  )0x0;
            local_60._16_8_ =
                 (__uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
                  )0x0;
            boost::asio::detail::
            wait_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:10344:35),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
            ::ptr::reset((ptr *)local_60);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 0x20));
            this->field_0x5db = this->field_0x5db | 4;
          }
        }
        else if ((*(uint *)&this->field_0x5d8 >> 0x1a & 1) != 0) {
          boost::asio::
          basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
          ::cancel(&this->m_inactivity_timer);
        }
      }
      update_want_tick(this);
    }
    else {
      iVar10 = *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                        field_0x1c +
               *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                        field_0xc;
      puVar1 = &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x4c;
      iVar11 = iVar10 + *(int *)puVar1;
      if ((iVar11 != 0 && SCARRY4(iVar10,*(int *)puVar1) == iVar11 < 0) ||
         (iVar10 = *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                            field_0x3c +
                   *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                            field_0x2c,
         puVar1 = &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x5c,
         iVar11 = iVar10 + *(int *)puVar1,
         iVar11 != 0 && SCARRY4(iVar10,*(int *)puVar1) == iVar11 < 0)) {
        state_updated(this);
      }
      stat::second_tick(&this->m_stat,tick_interval_ms_local);
      update_want_tick(this);
    }
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&self.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void torrent::second_tick(int const tick_interval_ms)
	{
		TORRENT_ASSERT(want_tick());
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		auto self = shared_from_this();

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& ext : m_extensions)
		{
			ext->tick();
		}

		if (m_abort) return;
#endif

		// if we're in upload only mode and we're auto-managed
		// leave upload mode every 10 minutes hoping that the error
		// condition has been fixed
		if (m_upload_mode && m_auto_managed && upload_mode_time() >=
			seconds(settings().get_int(settings_pack::optimistic_disk_retry)))
		{
			set_upload_mode(false);
		}

		if (is_paused() && !m_graceful_pause_mode)
		{
			// let the stats fade out to 0
			// check the rate before ticking the stats so that the last update is sent
			// with the rate equal to zero
			if (m_stat.low_pass_upload_rate() > 0 || m_stat.low_pass_download_rate() > 0)
				state_updated();
			m_stat.second_tick(tick_interval_ms);

			// the low pass transfer rate may just have dropped to 0
			update_want_tick();

			return;
		}

		if (settings().get_bool(settings_pack::rate_limit_ip_overhead))
		{
			int const up_limit = upload_limit();
			int const down_limit = download_limit();

			if (down_limit > 0
				&& m_stat.download_ip_overhead() >= down_limit
				&& alerts().should_post<performance_alert>())
			{
				alerts().emplace_alert<performance_alert>(get_handle()
					, performance_alert::download_limit_too_low);
			}

			if (up_limit > 0
				&& m_stat.upload_ip_overhead() >= up_limit
				&& alerts().should_post<performance_alert>())
			{
				alerts().emplace_alert<performance_alert>(get_handle()
					, performance_alert::upload_limit_too_low);
			}
		}

#ifndef TORRENT_DISABLE_STREAMING
		// ---- TIME CRITICAL PIECES ----

#if TORRENT_DEBUG_STREAMING > 0
		std::vector<partial_piece_info> queue;
		get_download_queue(&queue);

		std::vector<peer_info> peer_list;
		get_peer_info(peer_list);

		std::sort(queue.begin(), queue.end(), [](partial_piece_info const& lhs, partial_piece_info const& rhs)
			{ return lhs.piece_index < rhs.piece_index;; });

		std::printf("average piece download time: %.2f s (+/- %.2f s)\n"
			, m_average_piece_time / 1000.f
			, m_piece_time_deviation / 1000.f);
		for (auto& i : queue)
		{
			extern void print_piece(libtorrent::partial_piece_info* pp
				, std::vector<libtorrent::peer_info> const& peers
				, std::vector<time_critical_piece> const& time_critical);

			print_piece(&i, peer_list, m_time_critical_pieces);
		}
#endif // TORRENT_DEBUG_STREAMING

		if (!m_time_critical_pieces.empty() && !upload_mode())
		{
			request_time_critical_pieces();
		}
#endif // TORRENT_DISABLE_STREAMING

		// ---- WEB SEEDS ----

		maybe_connect_web_seeds();

		m_swarm_last_seen_complete = m_last_seen_complete;
		for (auto* p : m_connections)
		{
			TORRENT_INCREMENT(m_iterating_connections);

			// look for the peer that saw a seed most recently
			m_swarm_last_seen_complete = std::max(p->last_seen_complete(), m_swarm_last_seen_complete);

			// updates the peer connection's ul/dl bandwidth
			// resource requests
			p->second_tick(tick_interval_ms);
		}
#if TORRENT_ABI_VERSION <= 2
		if (m_ses.alerts().should_post<stats_alert>())
			m_ses.alerts().emplace_alert<stats_alert>(get_handle(), tick_interval_ms, m_stat);
#endif

		m_total_uploaded += m_stat.last_payload_uploaded();
		m_total_downloaded += m_stat.last_payload_downloaded();
		m_stat.second_tick(tick_interval_ms);

		// these counters are saved in the resume data, since they updated
		// we need to save the resume data too
		set_need_save_resume(torrent_handle::if_counters_changed);

		// if the rate is 0, there's no update because of network transfers
		if (m_stat.low_pass_upload_rate() > 0 || m_stat.low_pass_download_rate() > 0)
			state_updated();

		// this section determines whether the torrent is active or not. When it
		// changes state, it may also trigger the auto-manage logic to reconsider
		// which torrents should be queued and started. There is a low pass
		// filter in order to avoid flapping (auto_manage_startup).
		bool is_inactive = is_inactive_internal();

		if (settings().get_bool(settings_pack::dont_count_slow_torrents))
		{
			if (is_inactive != m_inactive && !m_pending_active_change)
			{
				int const delay = settings().get_int(settings_pack::auto_manage_startup);
				m_inactivity_timer.expires_after(seconds(delay));
				m_inactivity_timer.async_wait([self](error_code const& ec) {
					self->wrap(&torrent::on_inactivity_tick, ec); });
				m_pending_active_change = true;
			}
			else if (is_inactive == m_inactive
				&& m_pending_active_change)
			{
				m_inactivity_timer.cancel();
			}
		}

		// want_tick depends on whether the low pass transfer rates are non-zero
		// or not. They may just have turned zero in this last tick.
		update_want_tick();
	}